

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O0

int Mig_ManAppendAnd(Mig_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  Mig_Obj_t *p_00;
  int local_3c;
  int local_2c;
  Mig_Obj_t *pObj;
  int iLit1_local;
  int iLit0_local;
  Mig_Man_t *p_local;
  
  p_00 = Mig_ManAppendObj(p);
  if (iLit0 == iLit1) {
    __assert_fail("iLit0 != iLit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0x109,"int Mig_ManAppendAnd(Mig_Man_t *, int, int)");
  }
  local_2c = iLit1;
  if (iLit0 < iLit1) {
    local_2c = iLit0;
  }
  Mig_ObjSetFaninLit(p_00,0,local_2c);
  local_3c = iLit0;
  if (iLit0 < iLit1) {
    local_3c = iLit1;
  }
  Mig_ObjSetFaninLit(p_00,1,local_3c);
  iVar1 = Mig_ObjId(p_00);
  return iVar1 << 1;
}

Assistant:

static inline int Mig_ManAppendAnd( Mig_Man_t * p, int iLit0, int iLit1 )  
{ 
    Mig_Obj_t * pObj = Mig_ManAppendObj( p );
    assert( iLit0 != iLit1 );
    Mig_ObjSetFaninLit( pObj, 0, iLit0 < iLit1 ? iLit0 : iLit1 );
    Mig_ObjSetFaninLit( pObj, 1, iLit0 < iLit1 ? iLit1 : iLit0 );
    return Mig_ObjId( pObj ) << 1;
}